

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall wasm::Module::removeGlobals(Module *this,function<bool_(wasm::Global_*)> *pred)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<bool_(wasm::Global_*)>::function((function<bool_(wasm::Global_*)> *)&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>,std::unordered_map<wasm::Name,wasm::Global*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Global*>>>,wasm::Global>
            (&this->globals,&this->globalsMap,(function<bool_(wasm::Global_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void Module::removeGlobals(std::function<bool(Global*)> pred) {
  removeModuleElements(globals, globalsMap, pred);
}